

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O0

cio_address_family cio_socket_get_address_family(cio_socket *socket)

{
  int iVar1;
  socklen_t local_9c;
  undefined1 local_98 [4];
  socklen_t sock_addr_size;
  sockaddr_storage sock_addr;
  cio_socket *socket_local;
  
  sock_addr.__ss_align = (unsigned_long)socket;
  memset(local_98,0,0x80);
  local_9c = 0x80;
  iVar1 = getsockname(*(int *)(sock_addr.__ss_align + 0x80),(sockaddr *)local_98,&local_9c);
  if (iVar1 < 0) {
    socket_local._4_4_ = CIO_ADDRESS_FAMILY_UNSPEC;
  }
  else {
    socket_local._4_4_ = (cio_address_family)(ushort)local_98._0_2_;
  }
  return socket_local._4_4_;
}

Assistant:

enum cio_address_family cio_socket_get_address_family(const struct cio_socket *socket)
{
	struct sockaddr_storage sock_addr;
	memset(&sock_addr, 0, sizeof(sock_addr));
	socklen_t sock_addr_size = sizeof(sock_addr);

	if (getsockname(socket->impl.ev.fd, (struct sockaddr *)&sock_addr, &sock_addr_size) < 0) {
		return CIO_ADDRESS_FAMILY_UNSPEC;
	}

	return (enum cio_address_family)sock_addr.ss_family;
}